

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::SerializeWithCachedSizes
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,CodedOutputStream *output)

{
  uint64 uVar1;
  double dVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_local;
  
  uVar1 = evaluationindex(this);
  if (uVar1 != 0) {
    uVar1 = evaluationindex(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  dVar2 = evaluationvalue(this);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = evaluationvalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(2,dVar2,output);
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 evaluationIndex = 1;
  if (this->evaluationindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->evaluationindex(), output);
  }

  // double evaluationValue = 2;
  if (this->evaluationvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(2, this->evaluationvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
}